

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
               (char *args,time_point args_1,char *args_2,time_point args_3)

{
  Exception *this;
  string local_1f8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1c8;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1c0;
  make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  local_1b1;
  stringstream local_1b0 [8];
  stringstream msg;
  char *args_local_2;
  char *args_local;
  time_point args_local_3;
  time_point args_local_1;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1c8.__d.__r =
       (duration)
       (duration)
       args_3.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_1c0.__d.__r =
       (duration)
       (duration)
       args_1.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  detail::make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  ::operator()(&local_1b1,(stringstream *)local_1b0,args,args_1,args_2,args_3);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_1f8);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}